

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O2

bool __thiscall OpenMD::RigidBody::getAtomVel(RigidBody *this,Vector3d *vel,Atom *atom)

{
  bool bVar1;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  _Var2;
  Atom *local_18;
  
  local_18 = atom;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>,__gnu_cxx::__ops::_Iter_equals_val<OpenMD::Atom*const>>
                    ((this->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_18);
  if (_Var2._M_current ==
      (this->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar1 = false;
    snprintf(painCave.errMsg,2000,"Atom %d does not belong to rigid body %d.\n",
             (ulong)(uint)(local_18->super_StuntDouble).globalIndex_,
             (ulong)(uint)(this->super_StuntDouble).globalIndex_);
    painCave.isFatal = 0;
    simError();
  }
  else {
    bVar1 = getAtomVel(this,vel,(uint)((ulong)((long)_Var2._M_current -
                                              (long)(this->atoms_).
                                                                                                        
                                                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  return bVar1;
}

Assistant:

bool RigidBody::getAtomVel(Vector3d& vel, Atom* atom) {
    std::vector<Atom*>::iterator i;
    i = std::find(atoms_.begin(), atoms_.end(), atom);
    if (i != atoms_.end()) {
      return getAtomVel(vel, i - atoms_.begin());
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Atom %d does not belong to rigid body %d.\n",
               atom->getGlobalIndex(), getGlobalIndex());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }